

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExecutionContext.cpp
# Opt level: O0

Sampler2D * __thiscall rsg::ExecutionContext::getSampler2D(ExecutionContext *this,Variable *sampler)

{
  ValueStorage<64> *this_00;
  pointer ppVar1;
  VariableType *type;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_int,_rsg::Sampler2D>_> local_48;
  ConstStridedValueAccess<64> local_40;
  int local_2c;
  const_iterator cStack_28;
  int samplerNdx;
  ValueStorage<64> *local_20;
  ExecValueStorage *samplerVal;
  Variable *sampler_local;
  ExecutionContext *this_local;
  
  samplerVal = (ExecValueStorage *)sampler;
  sampler_local = (Variable *)this;
  cStack_28 = std::
              map<const_rsg::Variable_*,_rsg::ValueStorage<64>_*,_std::less<const_rsg::Variable_*>,_std::allocator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>_>
              ::find(&this->m_varValues,(key_type *)&samplerVal);
  ppVar1 = std::
           _Rb_tree_const_iterator<std::pair<const_rsg::Variable_*const,_rsg::ValueStorage<64>_*>_>
           ::operator->(&stack0xffffffffffffffd8);
  this_00 = ppVar1->second;
  local_20 = this_00;
  type = rsg::Variable::getType((Variable *)samplerVal);
  local_40 = ValueStorage<64>::getValue(this_00,type);
  local_2c = ConstStridedValueAccess<64>::asInt(&local_40,0);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<int,_rsg::Sampler2D,_std::less<int>,_std::allocator<std::pair<const_int,_rsg::Sampler2D>_>_>
       ::find(this->m_samplers2D,&local_2c);
  ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_int,_rsg::Sampler2D>_>::operator->
                     (&local_48);
  return &ppVar2->second;
}

Assistant:

const Sampler2D& ExecutionContext::getSampler2D (const Variable* sampler) const
{
	const ExecValueStorage* samplerVal = m_varValues.find(sampler)->second;

	int samplerNdx = samplerVal->getValue(sampler->getType()).asInt(0);

	return m_samplers2D.find(samplerNdx)->second;
}